

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FastAndEffectiveFeaturePreservingMeshDenoising.cpp
# Opt level: O0

void __thiscall
FastAndEffectiveFeaturePreservingMeshDenoising::initParameters
          (FastAndEffectiveFeaturePreservingMeshDenoising *this)

{
  ParameterSet *pPVar1;
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  FastAndEffectiveFeaturePreservingMeshDenoising *local_10;
  FastAndEffectiveFeaturePreservingMeshDenoising *this_local;
  
  local_10 = this;
  ParameterSet::removeAllParameter((this->super_MeshDenoisingBase).parameter_set_);
  pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"Face Neighbor",&local_31);
  ParameterSet::addParameter(pPVar1,(string *)local_30,0);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"Threshold T",&local_69);
  ParameterSet::addParameter(pPVar1,(string *)local_68,0.5);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"Normal Iteration Num.",&local_91);
  ParameterSet::addParameter(pPVar1,(string *)local_90,0x14);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"Vertex Iteration Num.",&local_b9);
  ParameterSet::addParameter(pPVar1,(string *)local_b8,0x32);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  return;
}

Assistant:

void FastAndEffectiveFeaturePreservingMeshDenoising::initParameters()
{
    parameter_set_->removeAllParameter();

    parameter_set_->addParameter(string("Face Neighbor"), 0);

    parameter_set_->addParameter(string("Threshold T"), 0.5);

    parameter_set_->addParameter(string("Normal Iteration Num."), 20);

    parameter_set_->addParameter(string("Vertex Iteration Num."), 50);

}